

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O1

int IPdr_ManRestoreClauses(Pdr_Man_t *p,Vec_Vec_t *vClauses,Vec_Int_t *vMap)

{
  uint uVar1;
  Vec_Vec_t *__ptr;
  void *pvVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int k;
  long lVar6;
  long lVar7;
  
  if (vClauses == (Vec_Vec_t *)0x0) {
    __assert_fail("vClauses",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                  ,0x156,"int IPdr_ManRestoreClauses(Pdr_Man_t *, Vec_Vec_t *, Vec_Int_t *)");
  }
  __ptr = p->vClauses;
  if (0 < __ptr->nSize) {
    lVar6 = 0;
    do {
      pvVar2 = __ptr->pArray[lVar6];
      if (pvVar2 != (void *)0x0) {
        if (*(void **)((long)pvVar2 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar2 + 8));
          *(undefined8 *)((long)pvVar2 + 8) = 0;
        }
        free(pvVar2);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < __ptr->nSize);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Vec_t *)0x0) {
    free(__ptr);
  }
  p->vClauses = vClauses;
  if ((vMap != (Vec_Int_t *)0x0) && (0 < vClauses->nSize)) {
    lVar6 = 0;
    do {
      if (vClauses->nSize <= lVar6) {
LAB_008f3450:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar2 = vClauses->pArray[lVar6];
      lVar5 = 0;
      while (lVar5 < *(int *)((long)pvVar2 + 4)) {
        lVar3 = *(long *)(*(long *)((long)pvVar2 + 8) + lVar5 * 8);
        if (0 < *(int *)(lVar3 + 0x10)) {
          lVar7 = 0;
          do {
            uVar1 = *(uint *)(lVar3 + 0x14 + lVar7 * 4);
            if ((int)uVar1 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x134,"int Abc_Lit2LitV(int *, int)");
            }
            if (vMap->pArray[uVar1 >> 1] < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            *(uint *)(lVar3 + 0x14 + lVar7 * 4) = (uVar1 & 1) + vMap->pArray[uVar1 >> 1] * 2;
            lVar7 = lVar7 + 1;
          } while (lVar7 < *(int *)(lVar3 + 0x10));
        }
        lVar5 = lVar5 + 1;
        if (vClauses->nSize <= lVar6) goto LAB_008f3450;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vClauses->nSize);
  }
  iVar4 = p->vClauses->nSize;
  if (0 < iVar4) {
    k = 0;
    do {
      IPdr_ManSetSolver(p,k,(uint)(k < iVar4 + -1));
      k = k + 1;
      iVar4 = p->vClauses->nSize;
    } while (k < iVar4);
  }
  return 0;
}

Assistant:

int IPdr_ManRestoreClauses( Pdr_Man_t * p, Vec_Vec_t * vClauses, Vec_Int_t * vMap )
{
    int i;

    assert(vClauses);

    Vec_VecFree(p->vClauses);
    p->vClauses = vClauses;

    // remap clause literals using mapping (old flop -> new flop) found in array vMap
    if ( vMap )
    {
        Pdr_Set_t * pSet; int j, k;   
        Vec_VecForEachEntry( Pdr_Set_t *, vClauses, pSet, i, j )
            for ( k = 0; k < pSet->nLits; k++ )
                pSet->Lits[k] = Abc_Lit2LitV( Vec_IntArray(vMap), pSet->Lits[k] );
    }

    for ( i = 0; i < Vec_VecSize(p->vClauses); ++i )
        IPdr_ManSetSolver( p, i, i < Vec_VecSize( p->vClauses ) - 1 );

    return 0;
}